

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader.hpp
# Opt level: O1

void __thiscall qe::Loader<7U>::load(Loader<7U> *this)

{
  char *pcVar1;
  char *pcVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  pointer pcVar6;
  anon_union_8_3_e2189aaa_for_vec<2,_unsigned_int,_(glm::qualifier)0>_3 aVar7;
  Loader<7U> *this_00;
  int iVar8;
  istream *piVar9;
  loader_error *plVar10;
  long *plVar11;
  ulong uVar12;
  size_type *psVar13;
  ulong uVar14;
  bool bVar15;
  vector<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
  indices;
  string line;
  value_type local_4c8;
  vec3 v;
  undefined4 uStack_48c;
  anon_union_8_3_e2189aaa_for_vec<2,_unsigned_int,_(glm::qualifier)0>_3 local_488;
  Loader<7U> *local_480;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_478;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_458;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  tnormals;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  tvertices;
  undefined1 *local_400 [2];
  undefined1 local_3f0 [16];
  vector<qe::subobj_t,_std::allocator<qe::subobj_t>_> *local_3e0;
  long *local_3d8 [2];
  long local_3c8 [2];
  long *local_3b8 [2];
  long local_3a8 [2];
  long *local_398 [2];
  long local_388 [2];
  long *local_378;
  ulong local_370;
  long local_368 [2];
  long *local_358;
  ulong local_350;
  long local_348 [2];
  long *local_338;
  ulong local_330;
  long local_328 [2];
  long *local_318 [2];
  long local_308 [2];
  long *local_2f8;
  ulong local_2f0;
  long local_2e8 [2];
  string local_2d8;
  string local_2b8;
  string local_298;
  string local_278;
  string local_258;
  ifstream file;
  undefined4 uStack_21c;
  byte abStack_218 [488];
  
  std::ifstream::ifstream(&file,(string *)&this->_path,_S_in);
  lVar5 = *(long *)(_file + -0x18);
  *(undefined4 *)((long)&uStack_21c + lVar5) = 1;
  std::ios::clear((int)&indices + (int)lVar5 + 0x2d0);
  tvertices.
  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  tvertices.
  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  tvertices.
  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  tnormals.
  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  tnormals.
  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  tnormals.
  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  indices.
  super__Vector_base<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  indices.
  super__Vector_base<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  indices.
  super__Vector_base<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_4c8.name._M_dataplus._M_p = (pointer)&local_4c8.name.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4c8,"");
  local_4c8.index = 0;
  local_4c8.size = 0;
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  local_3e0 = &this->_objects;
  local_480 = this;
LAB_00161301:
  do {
    piVar9 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&file,(string *)&line,'\n');
    if (((byte)piVar9[*(long *)(*(long *)piVar9 + -0x18) + 0x20] & 5) != 0) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)line._M_dataplus._M_p != &line.field_2) {
        operator_delete(line._M_dataplus._M_p,
                        CONCAT71(line.field_2._M_allocated_capacity._1_7_,
                                 line.field_2._M_local_buf[0]) + 1);
      }
      this_00 = local_480;
      local_4c8.size =
           ((long)indices.
                  super__Vector_base<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)indices.
                  super__Vector_base<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3) - local_4c8.index;
      if (local_4c8.name._M_string_length == 0) {
        std::__cxx11::string::_M_replace((ulong)&local_4c8,0,(char *)0x0,0x1bbe6b);
      }
      std::vector<qe::subobj_t,_std::allocator<qe::subobj_t>_>::push_back(local_3e0,&local_4c8);
      if ((abStack_218[*(long *)(_file + -0x18)] & 1) != 0) {
        plVar10 = (loader_error *)__cxa_allocate_exception(0x10);
        local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
        pcVar6 = (this_00->_path)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_258,pcVar6,pcVar6 + (this_00->_path)._M_string_length);
        loader_error::loader_error
                  (plVar10,&local_258,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/HTWGameDevelopment[P]2017WS_TeamOr8Bit/src/engine/loader.hpp"
                   ,0x135);
        __cxa_throw(plVar10,&loader_error::typeinfo,std::runtime_error::~runtime_error);
      }
      if ((long)indices.
                super__Vector_base<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)indices.
                super__Vector_base<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start == 0) {
        plVar10 = (loader_error *)__cxa_allocate_exception(0x10);
        line._M_dataplus._M_p = (pointer)&line.field_2;
        pcVar6 = (this_00->_path)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&line,pcVar6,pcVar6 + (this_00->_path)._M_string_length);
        plVar11 = (long *)std::__cxx11::string::append((char *)&line);
        local_2d8._M_dataplus._M_p = (pointer)*plVar11;
        psVar13 = (size_type *)(plVar11 + 2);
        if ((size_type *)local_2d8._M_dataplus._M_p == psVar13) {
          local_2d8.field_2._M_allocated_capacity = *psVar13;
          local_2d8.field_2._8_8_ = plVar11[3];
          local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
        }
        else {
          local_2d8.field_2._M_allocated_capacity = *psVar13;
        }
        local_2d8._M_string_length = plVar11[1];
        *plVar11 = (long)psVar13;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        loader_error::loader_error
                  (plVar10,&local_2d8,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/HTWGameDevelopment[P]2017WS_TeamOr8Bit/src/engine/loader.hpp"
                   ,0x137);
        __cxa_throw(plVar10,&loader_error::typeinfo,std::runtime_error::~runtime_error);
      }
      if (0x5555555555555555 <
          (ulong)(((long)indices.
                         super__Vector_base<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)indices.
                         super__Vector_base<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555)) {
        __assert_fail("indices.size() % 3 == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/HTWGameDevelopment[P]2017WS_TeamOr8Bit/src/engine/loader.hpp"
                      ,0x139,"void qe::Loader<7>::load()");
      }
      if (indices.
          super__Vector_base<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          indices.
          super__Vector_base<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        uVar12 = 0;
        uVar14 = 1;
        do {
          uVar3 = indices.
                  super__Vector_base<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar12].field_0.field_0.x;
          if ((ulong)(((long)tvertices.
                             super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)tvertices.
                             super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555)
              < (ulong)uVar3) {
            __assert_fail("indices[i].x <= tvertices.size()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/HTWGameDevelopment[P]2017WS_TeamOr8Bit/src/engine/loader.hpp"
                          ,0x13c,"void qe::Loader<7>::load()");
          }
          uVar4 = indices.
                  super__Vector_base<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar12].field_0.field_0.y;
          if ((ulong)(((long)tnormals.
                             super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)tnormals.
                             super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555)
              < (ulong)uVar4) {
            __assert_fail("indices[i].y <= tnormals.size()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/HTWGameDevelopment[P]2017WS_TeamOr8Bit/src/engine/loader.hpp"
                          ,0x13d,"void qe::Loader<7>::load()");
          }
          std::vector<qe::objv3_point_t,std::allocator<qe::objv3_point_t>>::
          emplace_back<glm::vec<3,float,(glm::qualifier)0>&,glm::vec<3,float,(glm::qualifier)0>&>
                    ((vector<qe::objv3_point_t,std::allocator<qe::objv3_point_t>> *)this_00,
                     tvertices.
                     super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + (long)(int)uVar3 + -1,
                     tnormals.
                     super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + (long)(int)uVar4 + -1);
          bVar15 = uVar14 < (ulong)((long)indices.
                                          super__Vector_base<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)indices.
                                          super__Vector_base<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 3);
          uVar12 = uVar14;
          uVar14 = (ulong)((int)uVar14 + 1);
        } while (bVar15);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4c8.name._M_dataplus._M_p != &local_4c8.name.field_2) {
        operator_delete(local_4c8.name._M_dataplus._M_p,
                        local_4c8.name.field_2._M_allocated_capacity + 1);
      }
      if (indices.
          super__Vector_base<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(indices.
                        super__Vector_base<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)indices.
                              super__Vector_base<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)indices.
                              super__Vector_base<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (tnormals.
          super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(tnormals.
                        super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)tnormals.
                              super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)tnormals.
                              super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (tvertices.
          super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(tvertices.
                        super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)tvertices.
                              super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)tvertices.
                              super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      std::ifstream::~ifstream(&file);
      return;
    }
    local_318[0] = local_308;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_318,line._M_dataplus._M_p,
               line._M_dataplus._M_p + line._M_string_length);
    local_2f8 = local_2e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"v ","");
    bVar15 = local_2f0 == 0;
    if (!bVar15) {
      if ((char)*local_318[0] == (char)*local_2f8) {
        uVar12 = 1;
        do {
          bVar15 = local_2f0 <= uVar12;
          if (local_2f0 <= uVar12) break;
          pcVar1 = (char *)((long)local_318[0] + uVar12);
          pcVar2 = (char *)((long)local_2f8 + uVar12);
          uVar12 = (ulong)((int)uVar12 + 1);
        } while (*pcVar1 == *pcVar2);
      }
      else {
        bVar15 = false;
      }
    }
    if (local_2f8 != local_2e8) {
      operator_delete(local_2f8,local_2e8[0] + 1);
    }
    if (local_318[0] != local_308) {
      operator_delete(local_318[0],local_308[0] + 1);
    }
    if (!bVar15) {
      local_398[0] = local_388;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_398,line._M_dataplus._M_p,
                 line._M_dataplus._M_p + line._M_string_length);
      local_338 = local_328;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_338,"vn ","");
      bVar15 = local_330 == 0;
      if (!bVar15) {
        if ((char)*local_398[0] == (char)*local_338) {
          uVar12 = 1;
          do {
            bVar15 = local_330 <= uVar12;
            if (local_330 <= uVar12) break;
            pcVar1 = (char *)((long)local_398[0] + uVar12);
            pcVar2 = (char *)((long)local_338 + uVar12);
            uVar12 = (ulong)((int)uVar12 + 1);
          } while (*pcVar1 == *pcVar2);
        }
        else {
          bVar15 = false;
        }
      }
      if (local_338 != local_328) {
        operator_delete(local_338,local_328[0] + 1);
      }
      if (local_398[0] != local_388) {
        operator_delete(local_398[0],local_388[0] + 1);
      }
      if (bVar15) {
        iVar8 = __isoc99_sscanf(line._M_dataplus._M_p,"vn %f %f %f",&v,
                                (undefined1 *)((long)&v.field_0 + 4),
                                (undefined1 *)((long)&v.field_0 + 8));
        if (iVar8 + 1U < 2) {
          plVar10 = (loader_error *)__cxa_allocate_exception(0x10);
          local_400[0] = local_3f0;
          pcVar6 = (local_480->_path)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_400,pcVar6,pcVar6 + (local_480->_path)._M_string_length);
          plVar11 = (long *)std::__cxx11::string::append((char *)local_400);
          local_458._M_dataplus._M_p = (pointer)*plVar11;
          psVar13 = (size_type *)(plVar11 + 2);
          if ((size_type *)local_458._M_dataplus._M_p == psVar13) {
            local_458.field_2._M_allocated_capacity = *psVar13;
            local_458.field_2._8_8_ = plVar11[3];
            local_458._M_dataplus._M_p = (pointer)&local_458.field_2;
          }
          else {
            local_458.field_2._M_allocated_capacity = *psVar13;
          }
          local_458._M_string_length = plVar11[1];
          *plVar11 = (long)psVar13;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          std::operator+(&local_478,&local_458,&line);
          plVar11 = (long *)std::__cxx11::string::append((char *)&local_478);
          local_298._M_dataplus._M_p = (pointer)*plVar11;
          psVar13 = (size_type *)(plVar11 + 2);
          if ((size_type *)local_298._M_dataplus._M_p == psVar13) {
            local_298.field_2._M_allocated_capacity = *psVar13;
            local_298.field_2._8_8_ = plVar11[3];
            local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
          }
          else {
            local_298.field_2._M_allocated_capacity = *psVar13;
          }
          local_298._M_string_length = plVar11[1];
          *plVar11 = (long)psVar13;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          loader_error::loader_error
                    (plVar10,&local_298,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/HTWGameDevelopment[P]2017WS_TeamOr8Bit/src/engine/loader.hpp"
                     ,0x115);
          __cxa_throw(plVar10,&loader_error::typeinfo,std::runtime_error::~runtime_error);
        }
        if (tnormals.
            super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            tnormals.
            super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
          ::_M_realloc_insert<glm::vec<3,float,(glm::qualifier)0>const&>
                    ((vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
                      *)&tnormals,
                     (iterator)
                     tnormals.
                     super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,&v);
        }
        else {
          ((tnormals.
            super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
            ._M_impl.super__Vector_impl_data._M_finish)->field_0).field_0.z = v.field_0.field_0.z;
          *(undefined8 *)
           &(tnormals.
             super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->field_0 = v.field_0._0_8_;
          tnormals.
          super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               tnormals.
               super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
        }
      }
      else {
        local_3b8[0] = local_3a8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_3b8,line._M_dataplus._M_p,
                   line._M_dataplus._M_p + line._M_string_length);
        local_358 = local_348;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_358,"f ","");
        bVar15 = local_350 == 0;
        if (!bVar15) {
          if ((char)*local_3b8[0] == (char)*local_358) {
            uVar12 = 1;
            do {
              bVar15 = local_350 <= uVar12;
              if (local_350 <= uVar12) break;
              pcVar1 = (char *)((long)local_3b8[0] + uVar12);
              pcVar2 = (char *)((long)local_358 + uVar12);
              uVar12 = (ulong)((int)uVar12 + 1);
            } while (*pcVar1 == *pcVar2);
          }
          else {
            bVar15 = false;
          }
        }
        if (local_358 != local_348) {
          operator_delete(local_358,local_348[0] + 1);
        }
        if (local_3b8[0] != local_3a8) {
          operator_delete(local_3b8[0],local_3a8[0] + 1);
        }
        if (bVar15) {
          iVar8 = __isoc99_sscanf(line._M_dataplus._M_p,"f %u//%u %u//%u %u//%u",&v,
                                  (undefined1 *)((long)&v.field_0 + 4),
                                  (undefined1 *)((long)&v.field_0 + 8),&uStack_48c,&local_488,
                                  &local_488.field_0.y);
          if (iVar8 + 1U < 2) {
            plVar10 = (loader_error *)__cxa_allocate_exception(0x10);
            local_400[0] = local_3f0;
            pcVar6 = (local_480->_path)._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_400,pcVar6,pcVar6 + (local_480->_path)._M_string_length);
            plVar11 = (long *)std::__cxx11::string::append((char *)local_400);
            local_458._M_dataplus._M_p = (pointer)*plVar11;
            psVar13 = (size_type *)(plVar11 + 2);
            if ((size_type *)local_458._M_dataplus._M_p == psVar13) {
              local_458.field_2._M_allocated_capacity = *psVar13;
              local_458.field_2._8_8_ = plVar11[3];
              local_458._M_dataplus._M_p = (pointer)&local_458.field_2;
            }
            else {
              local_458.field_2._M_allocated_capacity = *psVar13;
            }
            local_458._M_string_length = plVar11[1];
            *plVar11 = (long)psVar13;
            plVar11[1] = 0;
            *(undefined1 *)(plVar11 + 2) = 0;
            std::operator+(&local_478,&local_458,&line);
            plVar11 = (long *)std::__cxx11::string::append((char *)&local_478);
            local_2b8._M_dataplus._M_p = (pointer)*plVar11;
            psVar13 = (size_type *)(plVar11 + 2);
            if ((size_type *)local_2b8._M_dataplus._M_p == psVar13) {
              local_2b8.field_2._M_allocated_capacity = *psVar13;
              local_2b8.field_2._8_8_ = plVar11[3];
              local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
            }
            else {
              local_2b8.field_2._M_allocated_capacity = *psVar13;
            }
            local_2b8._M_string_length = plVar11[1];
            *plVar11 = (long)psVar13;
            plVar11[1] = 0;
            *(undefined1 *)(plVar11 + 2) = 0;
            loader_error::loader_error
                      (plVar10,&local_2b8,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/HTWGameDevelopment[P]2017WS_TeamOr8Bit/src/engine/loader.hpp"
                       ,0x122);
            __cxa_throw(plVar10,&loader_error::typeinfo,std::runtime_error::~runtime_error);
          }
          if (indices.
              super__Vector_base<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              indices.
              super__Vector_base<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<glm::vec<2,unsigned_int,(glm::qualifier)0>,std::allocator<glm::vec<2,unsigned_int,(glm::qualifier)0>>>
            ::_M_realloc_insert<glm::vec<2,unsigned_int,(glm::qualifier)0>const&>
                      ((vector<glm::vec<2,unsigned_int,(glm::qualifier)0>,std::allocator<glm::vec<2,unsigned_int,(glm::qualifier)0>>>
                        *)&indices,
                       (iterator)
                       indices.
                       super__Vector_base<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,
                       (vec<2,_unsigned_int,_(glm::qualifier)0> *)&v);
          }
          else {
            (indices.
             super__Vector_base<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->field_0 =
                 (anon_union_8_3_e2189aaa_for_vec<2,_unsigned_int,_(glm::qualifier)0>_3)
                 v.field_0._0_8_;
            indices.
            super__Vector_base<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 indices.
                 super__Vector_base<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
          }
          if (indices.
              super__Vector_base<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              indices.
              super__Vector_base<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<glm::vec<2,unsigned_int,(glm::qualifier)0>,std::allocator<glm::vec<2,unsigned_int,(glm::qualifier)0>>>
            ::_M_realloc_insert<glm::vec<2,unsigned_int,(glm::qualifier)0>const&>
                      ((vector<glm::vec<2,unsigned_int,(glm::qualifier)0>,std::allocator<glm::vec<2,unsigned_int,(glm::qualifier)0>>>
                        *)&indices,
                       (iterator)
                       indices.
                       super__Vector_base<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,
                       (vec<2,_unsigned_int,_(glm::qualifier)0> *)((long)&v.field_0 + 8));
          }
          else {
            aVar7.field_0.y = uStack_48c;
            aVar7.field_0.x = (uint)v.field_0.field_0.z;
            (indices.
             super__Vector_base<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->field_0 = aVar7;
            indices.
            super__Vector_base<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 indices.
                 super__Vector_base<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
          }
          if (indices.
              super__Vector_base<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              indices.
              super__Vector_base<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<glm::vec<2,unsigned_int,(glm::qualifier)0>,std::allocator<glm::vec<2,unsigned_int,(glm::qualifier)0>>>
            ::_M_realloc_insert<glm::vec<2,unsigned_int,(glm::qualifier)0>const&>
                      ((vector<glm::vec<2,unsigned_int,(glm::qualifier)0>,std::allocator<glm::vec<2,unsigned_int,(glm::qualifier)0>>>
                        *)&indices,
                       (iterator)
                       indices.
                       super__Vector_base<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,
                       (vec<2,_unsigned_int,_(glm::qualifier)0> *)&local_488.field_0);
          }
          else {
            (indices.
             super__Vector_base<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->field_0 = local_488;
            indices.
            super__Vector_base<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 indices.
                 super__Vector_base<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
          }
        }
        else {
          local_3d8[0] = local_3c8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_3d8,line._M_dataplus._M_p,
                     line._M_dataplus._M_p + line._M_string_length);
          local_378 = local_368;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_378,"o ","");
          bVar15 = local_370 == 0;
          if (!bVar15) {
            if ((char)*local_3d8[0] == (char)*local_378) {
              uVar12 = 1;
              do {
                bVar15 = local_370 <= uVar12;
                if (local_370 <= uVar12) break;
                pcVar1 = (char *)((long)local_3d8[0] + uVar12);
                pcVar2 = (char *)((long)local_378 + uVar12);
                uVar12 = (ulong)((int)uVar12 + 1);
              } while (*pcVar1 == *pcVar2);
            }
            else {
              bVar15 = false;
            }
          }
          if (local_378 != local_368) {
            operator_delete(local_378,local_368[0] + 1);
          }
          if (local_3d8[0] != local_3c8) {
            operator_delete(local_3d8[0],local_3c8[0] + 1);
          }
          if (bVar15) {
            local_4c8.size =
                 ((long)indices.
                        super__Vector_base<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)indices.
                        super__Vector_base<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) - local_4c8.index;
            if (local_4c8.name._M_string_length == 0) {
              std::__cxx11::string::_M_replace((ulong)&local_4c8,0,(char *)0x0,0x1bbe66);
            }
            std::vector<qe::subobj_t,_std::allocator<qe::subobj_t>_>::push_back
                      (local_3e0,&local_4c8);
            std::__cxx11::string::substr((ulong)&local_478,(ulong)&line);
            std::__cxx11::string::operator=((string *)&local_4c8,(string *)&local_478);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_478._M_dataplus._M_p != &local_478.field_2) {
              operator_delete(local_478._M_dataplus._M_p,local_478.field_2._M_allocated_capacity + 1
                             );
            }
            local_4c8.index =
                 (long)indices.
                       super__Vector_base<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)indices.
                       super__Vector_base<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3;
          }
        }
      }
      goto LAB_00161301;
    }
    iVar8 = __isoc99_sscanf(line._M_dataplus._M_p,"v %f %f %f",&v,
                            (undefined1 *)((long)&v.field_0 + 4),
                            (undefined1 *)((long)&v.field_0 + 8));
    if (iVar8 + 1U < 2) {
      plVar10 = (loader_error *)__cxa_allocate_exception(0x10);
      local_400[0] = local_3f0;
      pcVar6 = (local_480->_path)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_400,pcVar6,pcVar6 + (local_480->_path)._M_string_length);
      plVar11 = (long *)std::__cxx11::string::append((char *)local_400);
      local_458._M_dataplus._M_p = (pointer)*plVar11;
      psVar13 = (size_type *)(plVar11 + 2);
      if ((size_type *)local_458._M_dataplus._M_p == psVar13) {
        local_458.field_2._M_allocated_capacity = *psVar13;
        local_458.field_2._8_8_ = plVar11[3];
        local_458._M_dataplus._M_p = (pointer)&local_458.field_2;
      }
      else {
        local_458.field_2._M_allocated_capacity = *psVar13;
      }
      local_458._M_string_length = plVar11[1];
      *plVar11 = (long)psVar13;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      std::operator+(&local_478,&local_458,&line);
      plVar11 = (long *)std::__cxx11::string::append((char *)&local_478);
      local_278._M_dataplus._M_p = (pointer)*plVar11;
      psVar13 = (size_type *)(plVar11 + 2);
      if ((size_type *)local_278._M_dataplus._M_p == psVar13) {
        local_278.field_2._M_allocated_capacity = *psVar13;
        local_278.field_2._8_8_ = plVar11[3];
        local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
      }
      else {
        local_278.field_2._M_allocated_capacity = *psVar13;
      }
      local_278._M_string_length = plVar11[1];
      *plVar11 = (long)psVar13;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      loader_error::loader_error
                (plVar10,&local_278,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/HTWGameDevelopment[P]2017WS_TeamOr8Bit/src/engine/loader.hpp"
                 ,0x10b);
      __cxa_throw(plVar10,&loader_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if (tvertices.
        super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        tvertices.
        super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
      ::_M_realloc_insert<glm::vec<3,float,(glm::qualifier)0>const&>
                ((vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
                  *)&tvertices,
                 (iterator)
                 tvertices.
                 super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,&v);
    }
    else {
      ((tvertices.
        super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)->field_0).field_0.z = v.field_0.field_0.z;
      *(undefined8 *)
       &(tvertices.
         super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
         ._M_impl.super__Vector_impl_data._M_finish)->field_0 = v.field_0._0_8_;
      tvertices.
      super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           tvertices.
           super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1;
    }
  } while( true );
}

Assistant:

void load() {
            std::ifstream file(_path);
            file.exceptions(std::ifstream::badbit);
            std::vector<glm::vec3> tvertices;
            std::vector<glm::vec3> tnormals;
            std::vector<glm::uvec2> indices;

            subobj_t tobj {"", 0, 0};

            for(std::string line; std::getline(file, line, '\n');) {
                if(startswith(line, "v ")) {
                    glm::vec3 v;

                    switch(sscanf(line.c_str(), "v %f %f %f", &v.x, &v.y, &v.z)) {
                    case 0:
                    case EOF:
                        throw loader_error(std::string(_path) + "(" + line + ")", __FILE__, __LINE__);
                    }

                    tvertices.push_back(v);
                } else if(startswith(line, "vn ")) {
                    glm::vec3 v;

                    switch(sscanf(line.c_str(), "vn %f %f %f", &v.x, &v.y, &v.z)) {
                    case 0:
                    case EOF:
                        throw loader_error(std::string(_path) + "(" + line + ")", __FILE__, __LINE__);
                    }

                    tnormals.push_back(v);
                } else if(startswith(line, "f ")) {
                    std::array<glm::uvec2, 3> points;

                    switch(sscanf(line.c_str(), "f %u//%u %u//%u %u//%u",
                                  &points[0].x, &points[0].y,
                                  &points[1].x, &points[1].y,
                                  &points[2].x, &points[2].y)) {
                    case 0:
                    case EOF:
                        throw loader_error(std::string(_path) + " (" + line + ")", __FILE__, __LINE__);
                    }

                    indices.push_back(points[0]);
                    indices.push_back(points[1]);
                    indices.push_back(points[2]);
                } else if(startswith(line, "o ")) {
                    tobj.size = indices.size() - tobj.index;
                    if(tobj.name.empty()) tobj.name = "FIRSTNONAME";
                    _objects.push_back(tobj);
                    tobj.name = line.substr(2);
                    tobj.index = indices.size();
                }
            }

            tobj.size = indices.size() - tobj.index;
            if(tobj.name.empty()) tobj.name = "NONAME";
            _objects.push_back(tobj);

            if(file.bad()) throw loader_error(_path, __FILE__, __LINE__);

            if(indices.size() == 0) throw loader_error(std::string(_path) + " (no indices found)", __FILE__, __LINE__);

            assert(indices.size() % 3 == 0);

            for(unsigned int i = 0; i < indices.size(); ++i) {
                assert(indices[i].x <= tvertices.size());
                assert(indices[i].y <= tnormals.size());
                glm::ivec2 index = indices[i];
                _points.emplace_back(tvertices[index.x - 1], tnormals[index.y - 1]);
            }
        }